

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.h
# Opt level: O1

void __thiscall
HighsLinearSumBounds::sumScaled(HighsLinearSumBounds *this,HighsInt sum,double scale)

{
  pointer pHVar1;
  int iVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer piVar5;
  pointer piVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  HighsCDouble __tmp;
  
  HighsCDouble::operator*=
            ((this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start + sum,scale);
  HighsCDouble::operator*=
            ((this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start + sum,scale);
  HighsCDouble::operator*=
            ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start + sum,scale);
  HighsCDouble::operator*=
            ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start + sum,scale);
  if (scale < 0.0) {
    pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar4 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar1 = pHVar3 + sum;
    dVar7 = pHVar1->hi;
    dVar8 = pHVar1->lo;
    pHVar1 = pHVar4 + sum;
    dVar9 = pHVar1->lo;
    pHVar3 = pHVar3 + sum;
    pHVar3->hi = pHVar1->hi;
    pHVar3->lo = dVar9;
    pHVar4 = pHVar4 + sum;
    pHVar4->hi = dVar7;
    pHVar4->lo = dVar8;
    pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar4 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar1 = pHVar3 + sum;
    dVar7 = pHVar1->hi;
    dVar8 = pHVar1->lo;
    pHVar1 = pHVar4 + sum;
    dVar9 = pHVar1->lo;
    pHVar3 = pHVar3 + sum;
    pHVar3->hi = pHVar1->hi;
    pHVar3->lo = dVar9;
    pHVar4 = pHVar4 + sum;
    pHVar4->hi = dVar7;
    pHVar4->lo = dVar8;
    piVar5 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar5[sum];
    piVar5[sum] = piVar6[sum];
    piVar6[sum] = iVar2;
    piVar5 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar5[sum];
    piVar5[sum] = piVar6[sum];
    piVar6[sum] = iVar2;
  }
  return;
}

Assistant:

void sumScaled(HighsInt sum, double scale) {
    sumLowerOrig[sum] *= scale;
    sumUpperOrig[sum] *= scale;
    sumLower[sum] *= scale;
    sumUpper[sum] *= scale;

    if (scale < 0) {
      std::swap(sumLower[sum], sumUpper[sum]);
      std::swap(sumLowerOrig[sum], sumUpperOrig[sum]);
      std::swap(numInfSumLower[sum], numInfSumUpper[sum]);
      std::swap(numInfSumLowerOrig[sum], numInfSumUpperOrig[sum]);
    }
  }